

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::upresV(PtexSeparableKernel *this)

{
  int8_t *piVar1;
  float fVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  
  pfVar4 = this->kv;
  iVar3 = this->vw;
  iVar5 = iVar3 * 2;
  for (lVar6 = 0; 0 < iVar3 + (int)lVar6; lVar6 = lVar6 + -1) {
    fVar2 = pfVar4[(long)iVar3 + lVar6 + -1];
    pfVar4[(long)iVar5 + lVar6 * 2 + -1] = fVar2 * 0.5;
    pfVar4[(long)iVar5 + lVar6 * 2 + -2] = fVar2 * 0.5;
  }
  this->vw = iVar5;
  this->v = this->v << 1;
  piVar1 = &(this->res).vlog2;
  *piVar1 = *piVar1 + '\x01';
  return;
}

Assistant:

void upresV()
    {
        float* src = kv + vw-1;
        float* dst = kv + vw*2-2;
        for (int i = vw; i > 0; i--) {
            dst[0] = dst[1] = *src-- / 2;
            dst -=2;
        }
        vw *= 2;
        v *= 2;
        res.vlog2++;
    }